

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

void on_device_state_changed_callback
               (void *context,DEVICE_STATE previous_state,DEVICE_STATE new_state)

{
  time_t tVar1;
  AMQP_TRANSPORT_DEVICE_INSTANCE *registered_device;
  DEVICE_STATE new_state_local;
  DEVICE_STATE previous_state_local;
  void *context_local;
  
  if ((context != (void *)0x0) && (new_state != previous_state)) {
    *(DEVICE_STATE *)((long)context + 0x20) = new_state;
    tVar1 = get_time((time_t *)0x0);
    *(time_t *)((long)context + 0x38) = tVar1;
    if (new_state == DEVICE_STATE_STARTED) {
      reset_retry_control((AMQP_TRANSPORT_DEVICE_INSTANCE *)context);
      (**(code **)((long)context + 0x68))(0,6,*(undefined8 *)((long)context + 0xa0));
    }
    else if (new_state == DEVICE_STATE_STOPPED) {
      if ((*(int *)(*(long *)((long)context + 0x10) + 0x40) == 3) ||
         (*(int *)(*(long *)((long)context + 0x10) + 0x40) == 8)) {
        (**(code **)((long)context + 0x68))(1,6,*(undefined8 *)((long)context + 0xa0));
      }
      else if ((*(byte *)((long)context + 0x52) & 1) != 0) {
        (**(code **)((long)context + 0x68))(1,8,*(undefined8 *)((long)context + 0xa0));
      }
    }
    else if (new_state == DEVICE_STATE_ERROR_AUTH) {
      (**(code **)((long)context + 0x68))(1,2,*(undefined8 *)((long)context + 0xa0));
    }
    else if ((new_state == DEVICE_STATE_ERROR_AUTH_TIMEOUT) || (new_state == DEVICE_STATE_ERROR_MSG)
            ) {
      (**(code **)((long)context + 0x68))(1,5,*(undefined8 *)((long)context + 0xa0));
    }
  }
  return;
}

Assistant:

static void on_device_state_changed_callback(void* context, DEVICE_STATE previous_state, DEVICE_STATE new_state)
{
    if (context != NULL && new_state != previous_state)
    {
        AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)context;
        registered_device->device_state = new_state;
        registered_device->time_of_last_state_change = get_time(NULL);

        if (new_state == DEVICE_STATE_STARTED)
        {
            reset_retry_control(registered_device);

            registered_device->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_AUTHENTICATED, IOTHUB_CLIENT_CONNECTION_OK, registered_device->transport_ctx);
        }
        else if (new_state == DEVICE_STATE_STOPPED)
        {
            if (registered_device->transport_instance->state == AMQP_TRANSPORT_STATE_CONNECTED ||
                registered_device->transport_instance->state == AMQP_TRANSPORT_STATE_BEING_DESTROYED)
            {
                registered_device->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_OK, registered_device->transport_ctx);
            }
            else if (registered_device->is_quota_exceeded)
            {
                registered_device->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_QUOTA_EXCEEDED, registered_device->transport_ctx);
            }
        }
        else if (new_state == DEVICE_STATE_ERROR_AUTH)
        {
            registered_device->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_BAD_CREDENTIAL, registered_device->transport_ctx);
        }
        else if (new_state == DEVICE_STATE_ERROR_AUTH_TIMEOUT || new_state == DEVICE_STATE_ERROR_MSG)
        {
            registered_device->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_COMMUNICATION_ERROR, registered_device->transport_ctx);
        }
    }
}